

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateDefinition.cpp
# Opt level: O2

void __thiscall Shell::PredicateDefinition::count(PredicateDefinition *this,Clause *cl,int add)

{
  uint uVar1;
  undefined8 uVar2;
  uint i;
  ulong uVar3;
  
  uVar2 = *(undefined8 *)&cl->field_0x38;
  for (uVar3 = 0; ((uint)uVar2 & 0xfffff) != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = (cl->_literals[uVar3]->super_Term)._functor;
    PredData::add(this->_preds + (int)uVar1,
                  -(uint)(((cl->_literals[uVar3]->super_Term)._args[0]._content & 4) == 0) | 1,add,
                  this);
    if (add == 1) {
      Lib::Set<Kernel::Unit_*,_Lib::DefaultHash>::insert
                (&this->_preds[(int)uVar1].containingUnits,&cl->super_Unit);
    }
  }
  return;
}

Assistant:

void PredicateDefinition::count (Clause* cl, int add)
{
  unsigned clen=cl->length();
  for(unsigned i=0;i<clen;i++) {
    Literal* l=(*cl)[i];
    int pred = l->functor();
    _preds[pred].add(l->isPositive() ? 1 : -1, add, this);
    if(add==1) {
	_preds[pred].containingUnits.insert(cl);
    }
  }
}